

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O1

double c_abs(singlecomplex *z)

{
  float fVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = z->r;
  fVar3 = z->i;
  fVar1 = -fVar4;
  if (-fVar4 <= fVar4) {
    fVar1 = fVar4;
  }
  fVar4 = -fVar3;
  if (-fVar3 <= fVar3) {
    fVar4 = fVar3;
  }
  fVar3 = fVar4;
  if (fVar4 <= fVar1) {
    fVar3 = fVar1;
  }
  if ((fVar1 + fVar4 != fVar3) || (NAN(fVar1 + fVar4) || NAN(fVar3))) {
    if (fVar4 <= fVar1) {
      fVar1 = fVar4;
    }
    dVar2 = (double)((fVar1 / fVar3) * (fVar1 / fVar3)) + 1.0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    fVar3 = (float)(dVar2 * (double)fVar3);
  }
  return (double)fVar3;
}

Assistant:

double c_abs(singlecomplex *z)
{
    float temp;
    float real = z->r;
    float imag = z->i;

    if (real < 0) real = -real;
    if (imag < 0) imag = -imag;
    if (imag > real) {
	temp = real;
	real = imag;
	imag = temp;
    }
    if ((real+imag) == real) return(real);
  
    temp = imag/real;
    temp = real*sqrt(1.0 + temp*temp);  /*overflow!!*/
    return (temp);
}